

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Group.cpp
# Opt level: O1

void __thiscall adios2::core::Group::Group(Group *this,Group *G)

{
  pointer pcVar1;
  
  (this->currentPath)._M_dataplus._M_p = (pointer)&(this->currentPath).field_2;
  pcVar1 = (G->currentPath)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar1,pcVar1 + (G->currentPath)._M_string_length);
  this->groupDelimiter = G->groupDelimiter;
  (this->mapPtr).super___shared_ptr<adios2::core::Group::TreeMap,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  (this->mapPtr).super___shared_ptr<adios2::core::Group::TreeMap,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->ADIOS_root)._M_dataplus._M_p = (pointer)&(this->ADIOS_root).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->ADIOS_root,"_ADIOS_ROOT_","");
  (this->m_Gr).super___shared_ptr<adios2::core::Group,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_Gr).super___shared_ptr<adios2::core::Group,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->m_IO = G->m_IO;
  (this->mapPtr).super___shared_ptr<adios2::core::Group::TreeMap,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (G->mapPtr).super___shared_ptr<adios2::core::Group::TreeMap,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->mapPtr).
              super___shared_ptr<adios2::core::Group::TreeMap,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,
             &(G->mapPtr).
              super___shared_ptr<adios2::core::Group::TreeMap,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

Group::Group(const Group &G)
: currentPath(G.currentPath), groupDelimiter(G.groupDelimiter), m_IO(G.m_IO)
{
    mapPtr = G.mapPtr;
}